

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::AggregateMessageSet::~AggregateMessageSet(AggregateMessageSet *this)

{
  AggregateMessageSet *this_local;
  
  ~AggregateMessageSet(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

AggregateMessageSet::~AggregateMessageSet() {
  // @@protoc_insertion_point(destructor:proto2_unittest.AggregateMessageSet)
  SharedDtor(*this);
}